

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

int gray_convert_glyph_inner(gray_PWorker worker,int continued)

{
  int iVar1;
  FT_Error local_18;
  int error;
  int continued_local;
  gray_PWorker worker_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)worker);
  if (iVar1 == 0) {
    if (continued != 0) {
      FT_Trace_Disable();
    }
    local_18 = FT_Outline_Decompose(&worker->outline,&func_interface,worker);
    if (continued != 0) {
      FT_Trace_Enable();
    }
  }
  else {
    local_18 = 0x62;
  }
  return local_18;
}

Assistant:

static int
  gray_convert_glyph_inner( RAS_ARG_
                            int  continued )
  {
    volatile int  error;


    if ( ft_setjmp( ras.jump_buffer ) == 0 )
    {
      if ( continued )
        FT_Trace_Disable();
      error = FT_Outline_Decompose( &ras.outline, &func_interface, &ras );
      if ( continued )
        FT_Trace_Enable();

      FT_TRACE7(( "band [%d..%d]: %ld cell%s remaining/\n",
                  ras.min_ey,
                  ras.max_ey,
                  ras.cell_null - ras.cell_free,
                  ras.cell_null - ras.cell_free == 1 ? "" : "s" ));
    }
    else
    {
      error = FT_THROW( Raster_Overflow );

      FT_TRACE7(( "band [%d..%d]: to be bisected\n",
                  ras.min_ey, ras.max_ey ));
    }

    return error;
  }